

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
GoState<5U,_4U>::get_moves
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GoState<5U,_4U> *this)

{
  iterator iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  int i;
  uint i_00;
  int j;
  uint uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->depth < 0x3e9) {
    i_00 = 0;
    bVar3 = false;
    uStack_38 = in_RAX;
    do {
      uVar6 = 0;
      do {
        iVar4 = (*this->_vptr_GoState[6])(this,(ulong)i_00,uVar6,(ulong)(uint)this->player_to_move);
        if ((char)iVar4 != '\0') {
          iVar4 = ij_to_ind(i_00,(int)uVar6);
          uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
          iVar1._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar1,(int *)((long)&uStack_38 + 4));
          }
          else {
            *iVar1._M_current = iVar4;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        if (!bVar3) {
          iVar4 = (*this->_vptr_GoState[6])
                            (this,(ulong)i_00,uVar6,(ulong)(3 - this->player_to_move));
          if ((char)iVar4 != '\0') {
            bVar3 = true;
          }
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != 4);
      i_00 = i_00 + 1;
    } while (i_00 != 5);
    piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if ((piVar2 == iVar1._M_current) && (bVar3)) {
      if (piVar2 == (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,&pass);
      }
      else {
        *iVar1._M_current = -1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    return __return_storage_ptr__;
  }
  MCTS::assertion_failed
            ("false",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
             ,0x134);
}

Assistant:

virtual std::vector<Move> get_moves() const
	{
		std::vector<Move> moves;
		if (depth > 1000) {
			attest(false);
			return moves;
		}

		bool opponent_has_move = false;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (is_move_possible(i, j, player_to_move)) {
				moves.push_back(ij_to_ind(i, j));
			}

			if (!opponent_has_move && is_move_possible(i, j, 3 - player_to_move)) {
				opponent_has_move = true;
			}
		}}

		if (moves.empty() && opponent_has_move) {
			moves.push_back(pass);
		}

		return moves;
	}